

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O0

void Imf_3_4::anon_unknown_0::interleave_scalar(char *source,size_t outSize,char *out)

{
  char *pcVar1;
  char *stop;
  char *s;
  char *t2;
  char *t1;
  char *out_local;
  size_t outSize_local;
  char *source_local;
  
  s = out;
  t2 = source + (outSize + 1 >> 1);
  t1 = source;
  while( true ) {
    if (out + outSize <= s) {
      return;
    }
    pcVar1 = s + 1;
    *s = *t1;
    if (out + outSize <= pcVar1) break;
    s = s + 2;
    *pcVar1 = *t2;
    t2 = t2 + 1;
    t1 = t1 + 1;
  }
  return;
}

Assistant:

void
interleave_scalar (const char* source, size_t outSize, char* out)
{
    const char* t1   = source;
    const char* t2   = source + (outSize + 1) / 2;
    char*       s    = out;
    char* const stop = s + outSize;

    while (true)
    {
        if (s < stop)
            *(s++) = *(t1++);
        else
            break;

        if (s < stop)
            *(s++) = *(t2++);
        else
            break;
    }
}